

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::operator*(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *w)

{
  pointer pnVar1;
  int iVar2;
  cpp_dec_float<200U,_int,_void> *pcVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  pointer pnVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  byte bVar15;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b0;
  ulong uVar10;
  
  bVar15 = 0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  lVar5 = (long)*(int *)(this + 8);
  lVar9 = (long)(w->super_IdxSet).num;
  if (0 < lVar9 && 0 < lVar5) {
    iVar2 = *(int *)(*(long *)(this + 0x10) + -4 + lVar5 * 4);
    uVar6 = lVar5 - 1;
    iVar8 = (w->super_IdxSet).idx[lVar9 + -1];
    uVar10 = lVar9 - 1;
    iVar7 = (int)uVar10;
    iVar4 = (int)uVar6;
    if ((iVar4 != 0) && (iVar7 != 0)) {
      do {
        iVar4 = (int)uVar6;
        if (iVar2 == iVar8) {
          pcVar3 = (cpp_dec_float<200U,_int,_void> *)((long)iVar2 * 0x80 + *(long *)(this + 0x20));
          pnVar1 = (w->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar11 = pnVar1 + iVar8;
          pcVar12 = &local_b0;
          for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
            (pcVar12->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
            pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar15 * -8 + 4);
          }
          local_b0.exp = pnVar1[iVar8].m_backend.exp;
          local_b0.neg = pnVar1[iVar8].m_backend.neg;
          local_b0.fpclass = pnVar1[iVar8].m_backend.fpclass;
          local_b0.prec_elem = pnVar1[iVar8].m_backend.prec_elem;
          local_1b8.fpclass = cpp_dec_float_finite;
          local_1b8.prec_elem = 0x1c;
          local_1b8.data._M_elems[0] = 0;
          local_1b8.data._M_elems[1] = 0;
          local_1b8.data._M_elems[2] = 0;
          local_1b8.data._M_elems[3] = 0;
          local_1b8.data._M_elems[4] = 0;
          local_1b8.data._M_elems[5] = 0;
          local_1b8.data._M_elems[6] = 0;
          local_1b8.data._M_elems[7] = 0;
          local_1b8.data._M_elems[8] = 0;
          local_1b8.data._M_elems[9] = 0;
          local_1b8.data._M_elems[10] = 0;
          local_1b8.data._M_elems[0xb] = 0;
          local_1b8.data._M_elems[0xc] = 0;
          local_1b8.data._M_elems[0xd] = 0;
          local_1b8.data._M_elems[0xe] = 0;
          local_1b8.data._M_elems[0xf] = 0;
          local_1b8.data._M_elems[0x10] = 0;
          local_1b8.data._M_elems[0x11] = 0;
          local_1b8.data._M_elems[0x12] = 0;
          local_1b8.data._M_elems[0x13] = 0;
          local_1b8.data._M_elems[0x14] = 0;
          local_1b8.data._M_elems[0x15] = 0;
          local_1b8.data._M_elems[0x16] = 0;
          local_1b8.data._M_elems[0x17] = 0;
          local_1b8.data._M_elems[0x18] = 0;
          local_1b8.data._M_elems[0x19] = 0;
          local_1b8.data._M_elems._104_5_ = 0;
          local_1b8.data._M_elems[0x1b]._1_3_ = 0;
          local_1b8.exp = 0;
          local_1b8.neg = false;
          if (&local_1b8 != pcVar3) {
            pcVar12 = pcVar3;
            pcVar13 = &local_1b8;
            for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
              (pcVar13->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar15 * -8 + 4);
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar15 * -8 + 4);
            }
            local_1b8.exp = pcVar3->exp;
            local_1b8.neg = pcVar3->neg;
            local_1b8.fpclass = pcVar3->fpclass;
            local_1b8.prec_elem = pcVar3->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_1b8,&local_b0);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_138,&local_1b8);
          uVar6 = (ulong)(iVar4 - 1);
          iVar2 = *(int *)(*(long *)(this + 0x10) + -4 + (long)iVar4 * 4);
LAB_0059dfe5:
          iVar8 = (int)uVar10;
          uVar10 = (ulong)(iVar8 - 1);
          iVar8 = (w->super_IdxSet).idx[(long)iVar8 + -1];
        }
        else {
          if (iVar2 <= iVar8) goto LAB_0059dfe5;
          uVar6 = (ulong)(iVar4 - 1);
          iVar2 = *(int *)(*(long *)(this + 0x10) + -4 + (long)iVar4 * 4);
        }
        iVar7 = (int)uVar10;
        iVar4 = (int)uVar6;
      } while ((iVar4 != 0) && (iVar7 != 0));
    }
    if ((iVar4 != 0) && (iVar2 != iVar8)) {
      lVar5 = (long)iVar4;
      do {
        lVar5 = lVar5 + -1;
        iVar2 = *(int *)(*(long *)(this + 0x10) + lVar5 * 4);
        if (lVar5 == 0) break;
      } while (iVar2 != iVar8);
    }
    if ((iVar7 != 0) && (iVar2 != iVar8)) {
      lVar5 = (long)iVar7;
      do {
        lVar5 = lVar5 + -1;
        iVar8 = (w->super_IdxSet).idx[lVar5];
        if (lVar5 == 0) break;
      } while (iVar2 != iVar8);
    }
    if (iVar2 == iVar8) {
      pcVar3 = (cpp_dec_float<200U,_int,_void> *)((long)iVar2 * 0x80 + *(long *)(this + 0x20));
      pnVar1 = (w->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar11 = pnVar1 + iVar8;
      pcVar12 = &local_b0;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pcVar12->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar15 * -2 + 1) * 4);
      }
      local_b0.exp = pnVar1[iVar8].m_backend.exp;
      local_b0.neg = pnVar1[iVar8].m_backend.neg;
      local_b0.fpclass = pnVar1[iVar8].m_backend.fpclass;
      local_b0.prec_elem = pnVar1[iVar8].m_backend.prec_elem;
      local_1b8.fpclass = cpp_dec_float_finite;
      local_1b8.prec_elem = 0x1c;
      local_1b8.data._M_elems[0] = 0;
      local_1b8.data._M_elems[1] = 0;
      local_1b8.data._M_elems[2] = 0;
      local_1b8.data._M_elems[3] = 0;
      local_1b8.data._M_elems[4] = 0;
      local_1b8.data._M_elems[5] = 0;
      local_1b8.data._M_elems[6] = 0;
      local_1b8.data._M_elems[7] = 0;
      local_1b8.data._M_elems[8] = 0;
      local_1b8.data._M_elems[9] = 0;
      local_1b8.data._M_elems[10] = 0;
      local_1b8.data._M_elems[0xb] = 0;
      local_1b8.data._M_elems[0xc] = 0;
      local_1b8.data._M_elems[0xd] = 0;
      local_1b8.data._M_elems[0xe] = 0;
      local_1b8.data._M_elems[0xf] = 0;
      local_1b8.data._M_elems[0x10] = 0;
      local_1b8.data._M_elems[0x11] = 0;
      local_1b8.data._M_elems[0x12] = 0;
      local_1b8.data._M_elems[0x13] = 0;
      local_1b8.data._M_elems[0x14] = 0;
      local_1b8.data._M_elems[0x15] = 0;
      local_1b8.data._M_elems[0x16] = 0;
      local_1b8.data._M_elems[0x17] = 0;
      local_1b8.data._M_elems[0x18] = 0;
      local_1b8.data._M_elems[0x19] = 0;
      local_1b8.data._M_elems._104_5_ = 0;
      local_1b8.data._M_elems[0x1b]._1_3_ = 0;
      local_1b8.exp = 0;
      local_1b8.neg = false;
      if (&local_1b8 != pcVar3) {
        pcVar12 = pcVar3;
        pcVar13 = &local_1b8;
        for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
          (pcVar13->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar15 * -8 + 4);
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar15 * -8 + 4);
        }
        local_1b8.exp = pcVar3->exp;
        local_1b8.neg = pcVar3->neg;
        local_1b8.fpclass = pcVar3->fpclass;
        local_1b8.prec_elem = pcVar3->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_1b8,&local_b0);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_138,&local_1b8);
    }
  }
  pcVar12 = &local_138;
  pnVar14 = __return_storage_ptr__;
  for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pnVar14->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
    pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar15 * -2 + 1) * 4);
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar15 * -2 + 1) * 4);
  }
  (__return_storage_ptr__->m_backend).exp = local_138.exp;
  (__return_storage_ptr__->m_backend).neg = local_138.neg;
  (__return_storage_ptr__->m_backend).fpclass = local_138.fpclass;
  (__return_storage_ptr__->m_backend).prec_elem = local_138.prec_elem;
  return __return_storage_ptr__;
}

Assistant:

R operator*(const SSVectorBase<S>& w)
   {
      setup();

      StableSum<R> x;
      int i = size() - 1;
      int j = w.size() - 1;

      // both *this and w non-zero vectors?
      if(i >= 0 && j >= 0)
      {
         int vi = index(i);
         int wj = w.index(j);

         while(i != 0 && j != 0)
         {
            if(vi == wj)
            {
               x += VectorBase<R>::val[vi] * R(w.val[wj]);
               vi = index(--i);
               wj = w.index(--j);
            }
            else if(vi > wj)
               vi = index(--i);
            else
               wj = w.index(--j);
         }

         /* check remaining indices */

         while(i != 0 && vi != wj)
            vi = index(--i);

         while(j != 0 && vi != wj)
            wj = w.index(--j);

         if(vi == wj)
            x += VectorBase<R>::val[vi] * R(w.val[wj]);
      }

      return x;
   }